

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

void split_path_file(char **dir,char **file,char *path)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t __n;
  
  pcVar1 = path;
  do {
    pcVar3 = pcVar1;
    pcVar1 = strchr(pcVar3 + 1,0x2f);
  } while (pcVar1 != (char *)0x0);
  pcVar1 = pcVar3 + 1;
  if (pcVar3 == path) {
    pcVar1 = pcVar3;
  }
  if (dir == (char **)0x0) goto LAB_001094f2;
  if (path == (char *)0x0) {
LAB_001094ed:
    pcVar3 = (char *)0x0;
  }
  else {
    sVar4 = 0;
    sVar2 = (long)pcVar1 - (long)path;
    __n = sVar4;
    if (sVar2 != 0) {
      do {
        __n = sVar4;
        if (path[sVar4] == '\0') break;
        sVar4 = sVar4 + 1;
        __n = sVar2;
      } while (sVar2 != sVar4);
    }
    pcVar3 = (char *)malloc(__n + 1);
    if (pcVar3 == (char *)0x0) goto LAB_001094ed;
    memcpy(pcVar3,path,__n);
    pcVar3[__n] = '\0';
  }
  *dir = pcVar3;
LAB_001094f2:
  if (file != (char **)0x0) {
    pcVar1 = my_strdup(pcVar1);
    *file = pcVar1;
  }
  return;
}

Assistant:

void split_path_file(char ** dir, char ** file, const char * path) {
	const char * slash = path, * next;

#if defined(__WIN32)
	const char sep[] = "\\/";	// Windows allows either variant
#else
	const char sep[] = "/";
#endif

	while ((next = strpbrk(slash + 1, sep))) {
		slash = next;
	}

	if (path != slash) {
		slash++;
	}

	if (dir) {
		*dir = my_strndup(path, slash - path);
	}

	if (file) {
		*file = my_strdup(slash);
	}
}